

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O1

void duckdb::CurrentDatabaseFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  pointer pcVar1;
  ClientContext *context;
  string *psVar2;
  Value val;
  string local_78;
  Value local_58;
  
  context = ExpressionState::GetContext(state);
  psVar2 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + psVar2->_M_string_length);
  Value::Value(&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  Vector::Reference(result,&local_58);
  Value::~Value(&local_58);
  return;
}

Assistant:

static void CurrentDatabaseFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	Value val(DatabaseManager::GetDefaultDatabase(state.GetContext()));
	result.Reference(val);
}